

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.h
# Opt level: O0

void __thiscall
Ptex::v2_2::PtexReader::MetaData::getValue<signed_char>
          (MetaData *this,int index,MetaDataType requestedType,char **value,int *count)

{
  size_type sVar1;
  Entry *pEVar2;
  undefined8 *in_RCX;
  MetaDataType in_EDX;
  int in_ESI;
  long in_RDI;
  uint32_t *in_R8;
  Entry *e;
  
  if ((in_ESI < 0) ||
     (sVar1 = std::
              vector<Ptex::v2_2::PtexReader::MetaData::Entry_*,_std::allocator<Ptex::v2_2::PtexReader::MetaData::Entry_*>_>
              ::size((vector<Ptex::v2_2::PtexReader::MetaData::Entry_*,_std::allocator<Ptex::v2_2::PtexReader::MetaData::Entry_*>_>
                      *)(in_RDI + 0x40)), (int)sVar1 <= in_ESI)) {
    *in_RCX = 0;
    *in_R8 = 0;
    return;
  }
  pEVar2 = getEntry((MetaData *)count,e._4_4_);
  if ((pEVar2 != (Entry *)0x0) && (pEVar2->type == in_EDX)) {
    *in_RCX = pEVar2->data;
    *in_R8 = pEVar2->datasize;
    return;
  }
  *in_RCX = 0;
  *in_R8 = 0;
  return;
}

Assistant:

void getValue(int index, MetaDataType requestedType, const T*& value, int& count)
        {
	    if (index < 0 || index >= int(_entries.size())) {
                value = 0;
                count = 0;
                return;
            }
	    Entry* e = getEntry(index);
	    if (e && e->type == requestedType) {
	        value = (const T*) e->data;
	        count = int(e->datasize/sizeof(T));
	    }
	    else { value = 0; count = 0; }
        }